

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ClassDeclarationSyntax::setChild
          (ClassDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  NamedBlockClauseSyntax *pNVar4;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar5;
  ImplementsClauseSyntax *pIVar6;
  ParameterPortListSyntax *pPVar7;
  ExtendsClauseSyntax *pEVar8;
  logic_error *this_00;
  Token TVar9;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 0xc) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar3);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar9 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->virtualOrInterface).kind = TVar9.kind;
      (this->virtualOrInterface).field_0x2 = TVar9._2_1_;
      (this->virtualOrInterface).numFlags = (NumericTokenFlags)TVar9.numFlags.raw;
      (this->virtualOrInterface).rawLen = TVar9.rawLen;
      (this->virtualOrInterface).info = TVar9.info;
      break;
    case 2:
      TVar9 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->classKeyword).kind = TVar9.kind;
      (this->classKeyword).field_0x2 = TVar9._2_1_;
      (this->classKeyword).numFlags = (NumericTokenFlags)TVar9.numFlags.raw;
      (this->classKeyword).rawLen = TVar9.rawLen;
      (this->classKeyword).info = TVar9.info;
      break;
    case 3:
      TVar9 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->lifetime).kind = TVar9.kind;
      (this->lifetime).field_0x2 = TVar9._2_1_;
      (this->lifetime).numFlags = (NumericTokenFlags)TVar9.numFlags.raw;
      (this->lifetime).rawLen = TVar9.rawLen;
      (this->lifetime).info = TVar9.info;
      break;
    case 4:
      TVar9 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar9.kind;
      (this->name).field_0x2 = TVar9._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar9.numFlags.raw;
      (this->name).rawLen = TVar9.rawLen;
      (this->name).info = TVar9.info;
      break;
    case 5:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pPVar7 = (ParameterPortListSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pPVar7 = SyntaxNode::as<slang::syntax::ParameterPortListSyntax>(pSVar3);
      }
      this->parameters = pPVar7;
      break;
    case 6:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pEVar8 = (ExtendsClauseSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pEVar8 = SyntaxNode::as<slang::syntax::ExtendsClauseSyntax>(pSVar3);
      }
      this->extendsClause = pEVar8;
      break;
    case 7:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pIVar6 = (ImplementsClauseSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pIVar6 = SyntaxNode::as<slang::syntax::ImplementsClauseSyntax>(pSVar3);
      }
      this->implementsClause = pIVar6;
      break;
    case 8:
      TVar9 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar9.kind;
      (this->semi).field_0x2 = TVar9._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar9.numFlags.raw;
      (this->semi).rawLen = TVar9.rawLen;
      (this->semi).info = TVar9.info;
      break;
    case 9:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar5 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar3);
      (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar5->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar5->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->items).super_SyntaxListBase.childCount = (pSVar5->super_SyntaxListBase).childCount;
      sVar1 = (pSVar5->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
      (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar5->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
      (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 10:
      TVar9 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->endClass).kind = TVar9.kind;
      (this->endClass).field_0x2 = TVar9._2_1_;
      (this->endClass).numFlags = (NumericTokenFlags)TVar9.numFlags.raw;
      (this->endClass).rawLen = TVar9.rawLen;
      (this->endClass).info = TVar9.info;
      break;
    case 0xb:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pNVar4 = (NamedBlockClauseSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pNVar4 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar3);
      }
      this->endBlockName = pNVar4;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x7dc);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ClassDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: virtualOrInterface = child.token(); return;
        case 2: classKeyword = child.token(); return;
        case 3: lifetime = child.token(); return;
        case 4: name = child.token(); return;
        case 5: parameters = child.node() ? &child.node()->as<ParameterPortListSyntax>() : nullptr; return;
        case 6: extendsClause = child.node() ? &child.node()->as<ExtendsClauseSyntax>() : nullptr; return;
        case 7: implementsClause = child.node() ? &child.node()->as<ImplementsClauseSyntax>() : nullptr; return;
        case 8: semi = child.token(); return;
        case 9: items = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 10: endClass = child.token(); return;
        case 11: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}